

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O1

MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
* __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::createReferenceProgram
          (MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
           *__return_storage_ptr__,SeparateShaderTest *this,ProgramParams *pp)

{
  ostringstream *this_00;
  bool uniform;
  deUint32 dVar1;
  ProgramWrapper *program;
  string frgSrc;
  string vtxSrc;
  undefined1 local_1f0 [32];
  string local_1d0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  uniform = (this->m_params).useUniform;
  dVar1 = pp->vtxSeed;
  varyingCompatVtxOutputs
            ((vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *)
             local_1f0,&this->m_varyings);
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"vtxScale","");
  genVtxShaderSrc(&local_1d0,dVar1,
                  (vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *)
                  local_1f0,(string *)local_1b0,uniform,pp->vtxScale);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
  }
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::~vector
            ((vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *)
             local_1f0);
  dVar1 = pp->frgSeed;
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"frgScale","");
  genFrgShaderSrc((string *)local_1f0,dVar1,&(this->m_varyings).frgInputs,(string *)local_1b0,
                  uniform,pp->frgScale);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
  }
  createShaderProgram(__return_storage_ptr__,this,&local_1d0,(string *)local_1f0,false);
  program = (__return_storage_ptr__->
            super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
            ).m_data.ptr;
  (*program->_vptr_ProgramWrapper[2])(program);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"// Created monolithic shader program ",0x25);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  if (uniform != false) {
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"vtxScale","");
    setUniform(this,program,(string *)local_1b0,pp->vtxScale,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._0_8_ != local_1a0) {
      operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
    }
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"frgScale","");
    setUniform(this,program,(string *)local_1b0,pp->frgScale,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._0_8_ != local_1a0) {
      operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
    }
  }
  if ((pointer)local_1f0._0_8_ != (pointer)(local_1f0 + 0x10)) {
    operator_delete((void *)local_1f0._0_8_,(ulong)(local_1f0._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

MovePtr<ProgramWrapper> SeparateShaderTest::createReferenceProgram (const ProgramParams& pp)
{
	bool					useUniform	= m_params.useUniform;
	const string			vtxSrc		= genVtxShaderSrc(pp.vtxSeed,
														  varyingCompatVtxOutputs(m_varyings),
														  "vtxScale", useUniform, pp.vtxScale);
	const string			frgSrc		= genFrgShaderSrc(pp.frgSeed, m_varyings.frgInputs,
														  "frgScale", useUniform, pp.frgScale);
	MovePtr<ProgramWrapper>	program		= createShaderProgram(&vtxSrc, &frgSrc, false);
	GLuint					progName	= program->getProgramName();

	log() << TestLog::Message
		  << "// Created monolithic shader program " << progName
		  << TestLog::EndMessage;

	if (useUniform)
	{
		setUniform(*program, "vtxScale", pp.vtxScale, false);
		setUniform(*program, "frgScale", pp.frgScale, false);
	}

	return program;
}